

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

int imagetopnm(opj_image_t *image,char *outfile,int force_split)

{
  OPJ_UINT32 OVar1;
  OPJ_INT32 *pOVar2;
  uint uVar3;
  FILE *pFVar4;
  size_t sVar5;
  undefined8 uVar6;
  opj_image_comp_t *poVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  OPJ_UINT32 *pOVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  uint *puVar19;
  uint *local_70;
  uint *local_68;
  int local_60;
  int local_5c;
  
  poVar7 = image->comps;
  OVar1 = poVar7->prec;
  pcVar17 = outfile;
  if ((int)OVar1 < 0x11) {
    do {
      pcVar8 = pcVar17;
      pcVar17 = pcVar8 + 1;
    } while (*pcVar8 != '\0');
    uVar14 = image->numcomps;
    uVar12 = 1;
    if ((pcVar8[-2] & 0xdfU) != 0x47) {
      uVar12 = uVar14;
    }
    if ((force_split == 0) && (1 < uVar12)) {
      if (1 < uVar14) {
        pOVar13 = &poVar7[1].sgnd;
        uVar16 = 1;
        do {
          if (((poVar7->dx != ((opj_image_comp_t *)(pOVar13 + -8))->dx) ||
              (poVar7->dy != pOVar13[-7])) ||
             ((uVar16 < 3 && ((OVar1 != pOVar13[-2] || (poVar7->sgnd != *pOVar13))))))
          goto LAB_0010a820;
          uVar16 = uVar16 + 1;
          pOVar13 = pOVar13 + 0x10;
        } while (uVar14 != uVar16);
      }
      pFVar4 = fopen(outfile,"wb");
      if (pFVar4 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
        goto LAB_0010ae39;
      }
      poVar7 = image->comps;
      if (uVar12 < 3) {
        local_68 = (uint *)0x0;
        local_70 = (uint *)0x0;
      }
      else {
        local_70 = (uint *)poVar7[1].data;
        local_68 = (uint *)poVar7[2].data;
      }
      uVar14 = poVar7->w;
      uVar3 = poVar7->h;
      uVar10 = ~(-1 << ((byte)OVar1 & 0x1f));
      pOVar2 = poVar7->data;
      if ((uVar12 == 4) || (uVar12 == 2)) {
        pcVar17 = "GRAYSCALE_ALPHA";
        if (2 < uVar12) {
          pcVar17 = "RGB_ALPHA";
        }
        uVar6 = opj_version();
        fprintf(pFVar4,
                "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n"
                ,uVar6,(ulong)uVar14,(ulong)uVar3,(ulong)uVar12,(ulong)uVar10,pcVar17);
        poVar7 = image->comps;
        puVar19 = (uint *)poVar7[(ulong)uVar12 - 1].data;
        if (poVar7[(ulong)uVar12 - 1].sgnd == 0) {
          iVar11 = 0;
        }
        else {
          iVar11 = 1 << ((char)poVar7[(ulong)uVar12 - 1].prec - 1U & 0x1f);
        }
      }
      else {
        uVar6 = opj_version();
        iVar11 = 0;
        fprintf(pFVar4,"P6\n# OpenJPEG-%s\n%d %d\n%d\n",uVar6,(ulong)uVar14,(ulong)uVar3,
                (ulong)uVar10);
        poVar7 = image->comps;
        puVar19 = (uint *)0x0;
      }
      local_5c = 0;
      iVar9 = 0;
      if (poVar7->sgnd != 0) {
        iVar9 = 1 << ((char)poVar7->prec - 1U & 0x1f);
      }
      local_60 = 0;
      if (2 < uVar12) {
        local_60 = 0;
        local_5c = 0;
        if (poVar7[1].sgnd != 0) {
          local_5c = 1 << ((char)poVar7[1].prec - 1U & 0x1f);
        }
        if (poVar7[2].sgnd != 0) {
          local_60 = 1 << ((char)poVar7[2].prec - 1U & 0x1f);
        }
      }
      if (0 < (int)(uVar3 * uVar14)) {
        lVar18 = 0;
        do {
          uVar10 = pOVar2[lVar18];
          if ((int)OVar1 < 9) {
            uVar15 = 0;
            if (0 < (int)uVar10) {
              uVar15 = uVar10;
            }
            uVar15 = uVar15 & 0xff;
            if (0xff < (int)uVar10) {
              uVar15 = 0xff;
            }
            fputc(uVar15,pFVar4);
            if (2 < uVar12) {
              uVar10 = *local_70;
              local_70 = local_70 + 1;
              uVar15 = 0;
              if (0 < (int)uVar10) {
                uVar15 = uVar10;
              }
              uVar15 = uVar15 & 0xff;
              if (0xff < (int)uVar10) {
                uVar15 = 0xff;
              }
              fputc(uVar15,pFVar4);
              uVar10 = *local_68;
              local_68 = local_68 + 1;
              uVar15 = 0;
              if (0 < (int)uVar10) {
                uVar15 = uVar10;
              }
              uVar15 = uVar15 & 0xff;
              if (0xff < (int)uVar10) {
                uVar15 = 0xff;
              }
              fputc(uVar15,pFVar4);
            }
            if ((uVar12 == 4) || (uVar12 == 2)) {
              uVar10 = *puVar19;
              puVar19 = puVar19 + 1;
              uVar15 = 0;
              if (0 < (int)uVar10) {
                uVar15 = uVar10;
              }
              uVar15 = uVar15 & 0xff;
              if (0xff < (int)uVar10) {
                uVar15 = 0xff;
              }
              fputc(uVar15,pFVar4);
            }
          }
          else {
            uVar10 = uVar10 + iVar9;
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if (0xfffe < (int)uVar10) {
              uVar10 = 0xffff;
            }
            fprintf(pFVar4,"%c%c",(ulong)(uVar10 >> 8));
            if (2 < uVar12) {
              uVar10 = *local_70 + local_5c;
              local_70 = local_70 + 1;
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if (0xfffe < (int)uVar10) {
                uVar10 = 0xffff;
              }
              fprintf(pFVar4,"%c%c",(ulong)(uVar10 >> 8),(ulong)(uVar10 & 0xff));
              uVar10 = *local_68 + local_60;
              local_68 = local_68 + 1;
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if (0xfffe < (int)uVar10) {
                uVar10 = 0xffff;
              }
              fprintf(pFVar4,"%c%c",(ulong)(uVar10 >> 8));
            }
            if ((uVar12 == 4) || (uVar12 == 2)) {
              uVar10 = *puVar19 + iVar11;
              puVar19 = puVar19 + 1;
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              uVar16 = (ulong)uVar10;
              if (0xfffe < (int)uVar10) {
                uVar16 = 0xffff;
              }
              fprintf(pFVar4,"%c%c",uVar16 >> 8);
            }
          }
          lVar18 = lVar18 + 1;
        } while (uVar3 * uVar14 != (int)lVar18);
      }
      fclose(pFVar4);
    }
    else {
LAB_0010a820:
      if (uVar12 < uVar14) {
        imagetopnm_cold_1();
      }
      sVar5 = strlen(outfile);
      pcVar17 = (char *)malloc(sVar5 + 8);
      if (pcVar17 == (char *)0x0) {
        imagetopnm_cold_3();
        goto LAB_0010ae39;
      }
      if (uVar12 != 0) {
        uVar16 = 0;
        do {
          if (uVar12 < 2) {
            strcpy(pcVar17,outfile);
          }
          else {
            sVar5 = strlen(outfile);
            strncpy(pcVar17,outfile,sVar5 - 4);
            sprintf(pcVar17 + (sVar5 - 4),"_%u.pgm",uVar16 & 0xffffffff);
          }
          pFVar4 = fopen(pcVar17,"wb");
          if (pFVar4 == (FILE *)0x0) {
            imagetopnm_cold_2();
            goto LAB_0010ae39;
          }
          poVar7 = image->comps;
          uVar14 = poVar7[uVar16].w;
          uVar3 = poVar7[uVar16].h;
          OVar1 = poVar7[uVar16].prec;
          uVar6 = opj_version();
          fprintf(pFVar4,"P5\n#OpenJPEG-%s\n%d %d\n%d\n",uVar6,(ulong)uVar14,(ulong)uVar3,
                  (ulong)(uint)~(-1 << ((byte)OVar1 & 0x1f)));
          poVar7 = image->comps;
          pOVar2 = poVar7[uVar16].data;
          if (pOVar2 != (OPJ_INT32 *)0x0) {
            if (poVar7[uVar16].sgnd == 0) {
              iVar11 = 0;
            }
            else {
              iVar11 = 1 << ((char)poVar7[uVar16].prec - 1U & 0x1f);
            }
            iVar9 = uVar3 * uVar14;
            if ((int)OVar1 < 9) {
              if (0 < iVar9) {
                lVar18 = 0;
                do {
                  uVar3 = pOVar2[lVar18] + iVar11;
                  uVar14 = 0;
                  if (0 < (int)uVar3) {
                    uVar14 = uVar3;
                  }
                  uVar14 = uVar14 & 0xff;
                  if (0xff < (int)uVar3) {
                    uVar14 = 0xff;
                  }
                  fputc(uVar14,pFVar4);
                  lVar18 = lVar18 + 1;
                } while (iVar9 != (int)lVar18);
              }
            }
            else if (0 < iVar9) {
              lVar18 = 0;
              do {
                uVar14 = pOVar2[lVar18] + iVar11;
                if (pOVar2[lVar18] + iVar11 < 1) {
                  uVar14 = 0;
                }
                if (0xfffe < (int)uVar14) {
                  uVar14 = 0xffff;
                }
                fprintf(pFVar4,"%c%c",(ulong)(uVar14 >> 8),(ulong)uVar14 & 0xff);
                lVar18 = lVar18 + 1;
              } while (iVar9 != (int)lVar18);
            }
          }
          fclose(pFVar4);
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar12);
      }
      free(pcVar17);
    }
    iVar11 = 0;
  }
  else {
    fprintf(_stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16\n\t: refused.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/bin/jp2/convert.c"
            ,0x7f4,OVar1);
LAB_0010ae39:
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

int imagetopnm(opj_image_t * image, const char *outfile, int force_split)
{
    int *red, *green, *blue, *alpha;
    int wr, hr, max;
    int i;
    unsigned int compno, ncomp;
    int adjustR, adjustG, adjustB, adjustA;
    int fails, two, want_gray, has_alpha, triple;
    int prec, v;
    FILE *fdest = NULL;
    const char *tmp = outfile;
    char *destname;

    alpha = NULL;

    if ((prec = (int)image->comps[0].prec) > 16) {
        fprintf(stderr, "%s:%d:imagetopnm\n\tprecision %d is larger than 16"
                "\n\t: refused.\n", __FILE__, __LINE__, prec);
        return 1;
    }
    two = has_alpha = 0;
    fails = 1;
    ncomp = image->numcomps;

    while (*tmp) {
        ++tmp;
    }
    tmp -= 2;
    want_gray = (*tmp == 'g' || *tmp == 'G');
    ncomp = image->numcomps;

    if (want_gray) {
        ncomp = 1;
    }

    if ((force_split == 0) && ncomp >= 2 &&
            are_comps_similar(image)) {
        fdest = fopen(outfile, "wb");

        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return fails;
        }
        two = (prec > 8);
        triple = (ncomp > 2);
        wr = (int)image->comps[0].w;
        hr = (int)image->comps[0].h;
        max = (1 << prec) - 1;
        has_alpha = (ncomp == 4 || ncomp == 2);

        red = image->comps[0].data;

        if (triple) {
            green = image->comps[1].data;
            blue = image->comps[2].data;
        } else {
            green = blue = NULL;
        }

        if (has_alpha) {
            const char *tt = (triple ? "RGB_ALPHA" : "GRAYSCALE_ALPHA");

            fprintf(fdest, "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\n"
                    "MAXVAL %d\nTUPLTYPE %s\nENDHDR\n", opj_version(),
                    wr, hr, ncomp, max, tt);
            alpha = image->comps[ncomp - 1].data;
            adjustA = (image->comps[ncomp - 1].sgnd ?
                       1 << (image->comps[ncomp - 1].prec - 1) : 0);
        } else {
            fprintf(fdest, "P6\n# OpenJPEG-%s\n%d %d\n%d\n",
                    opj_version(), wr, hr, max);
            adjustA = 0;
        }
        adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);

        if (triple) {
            adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
        } else {
            adjustG = adjustB = 0;
        }

        for (i = 0; i < wr * hr; ++i) {
            if (two) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (triple) {
                    v = *green + adjustG;
                    ++green;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                    v =  *blue + adjustB;
                    ++blue;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                }/* if(triple) */

                if (has_alpha) {
                    v = *alpha + adjustA;
                    ++alpha;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
                continue;

            }   /* if(two) */

            /* prec <= 8: */
            v = *red++;
            if (v > 255) {
                v = 255;
            } else if (v < 0) {
                v = 0;
            }

            fprintf(fdest, "%c", (unsigned char)v);
            if (triple) {
                v = *green++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
                v = *blue++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
            if (has_alpha) {
                v = *alpha++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }   /* for(i */

        fclose(fdest);
        return 0;
    }

    /* YUV or MONO: */

    if (image->numcomps > ncomp) {
        fprintf(stderr, "WARNING -> [PGM file] Only the first component\n");
        fprintf(stderr, "           is written to the file\n");
    }
    destname = (char*)malloc(strlen(outfile) + 8);
    if (destname == NULL) {
        fprintf(stderr, "imagetopnm: memory out\n");
        return 1;
    }
    for (compno = 0; compno < ncomp; compno++) {
        if (ncomp > 1) {
            /*sprintf(destname, "%d.%s", compno, outfile);*/
            const size_t olen = strlen(outfile);
            const size_t dotpos = olen - 4;

            strncpy(destname, outfile, dotpos);
            sprintf(destname + dotpos, "_%u.pgm", compno);
        } else {
            sprintf(destname, "%s", outfile);
        }

        fdest = fopen(destname, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", destname);
            free(destname);
            return 1;
        }
        wr = (int)image->comps[compno].w;
        hr = (int)image->comps[compno].h;
        prec = (int)image->comps[compno].prec;
        max = (1 << prec) - 1;

        fprintf(fdest, "P5\n#OpenJPEG-%s\n%d %d\n%d\n",
                opj_version(), wr, hr, max);

        red = image->comps[compno].data;
        if (!red) {
            fclose(fdest);
            continue;
        }

        adjustR =
            (image->comps[compno].sgnd ? 1 << (image->comps[compno].prec - 1) : 0);

        if (prec > 8) {
            for (i = 0; i < wr * hr; i++) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (has_alpha) {
                    v = *alpha++;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
            }/* for(i */
        } else { /* prec <= 8 */
            for (i = 0; i < wr * hr; ++i) {
                v = *red + adjustR;
                ++red;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }
        fclose(fdest);
    } /* for (compno */
    free(destname);

    return 0;
}